

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixEnv::StartThread
          (PosixEnv *this,_func_void_void_ptr *thread_main,void *thread_main_arg)

{
  void **in_RSI;
  long in_FS_OFFSET;
  thread *unaff_retaddr;
  thread new_thread;
  thread *in_stack_ffffffffffffffb8;
  _func_void_void_ptr **__f;
  
  __f = *(_func_void_void_ptr ***)(in_FS_OFFSET + 0x28);
  std::thread::thread<void(*&)(void*),void*&,void>(unaff_retaddr,__f,in_RSI);
  std::thread::detach();
  std::thread::~thread(in_stack_ffffffffffffffb8);
  if (*(_func_void_void_ptr ***)(in_FS_OFFSET + 0x28) == __f) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartThread(void (*thread_main)(void* thread_main_arg),
                   void* thread_main_arg) override {
    std::thread new_thread(thread_main, thread_main_arg);
    new_thread.detach();
  }